

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

bool __thiscall flatbuffers::Parser::SetRootType(Parser *this,char *name)

{
  Namespace *this_00;
  char *__s;
  StructDef *pSVar1;
  allocator<char> local_91;
  string local_90;
  string local_70;
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *name_local;
  Parser *this_local;
  
  local_18 = name;
  name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,name,&local_39);
  pSVar1 = LookupStruct(this,&local_38);
  this->root_struct_def_ = pSVar1;
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  __s = local_18;
  if (this->root_struct_def_ == (StructDef *)0x0) {
    this_00 = this->current_namespace_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,__s,&local_91);
    Namespace::GetFullyQualifiedName(&local_70,this_00,&local_90,1000);
    pSVar1 = LookupStruct(this,&local_70);
    this->root_struct_def_ = pSVar1;
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  return this->root_struct_def_ != (StructDef *)0x0;
}

Assistant:

bool Parser::SetRootType(const char *name) {
  root_struct_def_ = LookupStruct(name);
  if (!root_struct_def_)
    root_struct_def_ =
        LookupStruct(current_namespace_->GetFullyQualifiedName(name));
  return root_struct_def_ != nullptr;
}